

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::TextureParameterQueriesTestCase::testVirtualPageSizeIndexARB
          (TextureParameterQueriesTestCase *this,Functions *gl,GLint target,GLint expectedError)

{
  stringstream *log;
  bool bVar1;
  GLenum GVar2;
  ostream *poVar3;
  GLint testValueInt;
  GLfloat testValueFloat;
  GLuint testValueUInt;
  GLint local_3c;
  GLfloat local_38;
  GLuint local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Testing VIRTUAL_PAGE_SIZE_INDEX_ARB for target: ",0x30);
  poVar3 = (ostream *)std::ostream::operator<<(&this->field_0x88,target);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
  bVar1 = true;
  if (expectedError == 0) {
    bVar1 = checkGetTexParameter(this,gl,target,0x91a7,0);
  }
  log = &this->mLog;
  if (bVar1 != false) {
    (*gl->texParameteri)(target,0x91a7,1);
    GVar2 = (*gl->getError)();
    if (expectedError == 0) {
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x24f);
      bVar1 = checkGetTexParameter(this,gl,target,0x91a7,1);
      (*gl->texParameteri)(target,0x91a7,0);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x254);
    }
    else {
      bVar1 = SparseTextureUtils::verifyQueryError
                        (log,"glTexParameteri",target,0x91a7,GVar2,expectedError);
    }
  }
  if (bVar1 != false) {
    (*gl->texParameterf)(target,0x91a7,2.0);
    GVar2 = (*gl->getError)();
    if (expectedError == 0) {
      glu::checkError(GVar2,"glTexParameterf error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x260);
      bVar1 = checkGetTexParameter(this,gl,target,0x91a7,2);
      (*gl->texParameteri)(target,0x91a7,0);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x264);
    }
    else {
      bVar1 = SparseTextureUtils::verifyQueryError
                        (log,"glTexParameterf",target,0x91a7,GVar2,expectedError);
    }
  }
  if (bVar1 != false) {
    local_3c = 8;
    (*gl->texParameteriv)(target,0x91a7,&local_3c);
    GVar2 = (*gl->getError)();
    if (expectedError == 0) {
      glu::checkError(GVar2,"glTexParameteriv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x271);
      bVar1 = checkGetTexParameter(this,gl,target,0x91a7,8);
      (*gl->texParameteri)(target,0x91a7,0);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x275);
    }
    else {
      bVar1 = SparseTextureUtils::verifyQueryError
                        (log,"glTexParameteriv",target,0x91a7,GVar2,expectedError);
    }
  }
  if (bVar1 != false) {
    local_38 = 10.0;
    (*gl->texParameterfv)(target,0x91a7,&local_38);
    GVar2 = (*gl->getError)();
    if (expectedError == 0) {
      glu::checkError(GVar2,"glTexParameterfv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x282);
      bVar1 = checkGetTexParameter(this,gl,target,0x91a7,10);
      (*gl->texParameteri)(target,0x91a7,0);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x286);
    }
    else {
      bVar1 = SparseTextureUtils::verifyQueryError
                        (log,"glTexParameterfv",target,0x91a7,GVar2,expectedError);
    }
  }
  if (bVar1 != false) {
    local_3c = 6;
    (*gl->texParameterIiv)(target,0x91a7,&local_3c);
    GVar2 = (*gl->getError)();
    if (expectedError == 0) {
      glu::checkError(GVar2,"glTexParameterIiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x293);
      bVar1 = checkGetTexParameter(this,gl,target,0x91a7,6);
      (*gl->texParameteri)(target,0x91a7,0);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x297);
    }
    else {
      bVar1 = SparseTextureUtils::verifyQueryError
                        (log,"glTexParameterIiv",target,0x91a7,GVar2,expectedError);
    }
  }
  if (bVar1 != false) {
    local_34 = 0x10;
    (*gl->texParameterIuiv)(target,0x91a7,&local_34);
    GVar2 = (*gl->getError)();
    if (expectedError == 0) {
      glu::checkError(GVar2,"glTexParameterIuiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x2a4);
      bVar1 = checkGetTexParameter(this,gl,target,0x91a7,0x10);
      (*gl->texParameteri)(target,0x91a7,0);
      GVar2 = (*gl->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x2a8);
    }
    else {
      bVar1 = SparseTextureUtils::verifyQueryError
                        (log,"glTexParameterIuiv",target,0x91a7,GVar2,expectedError);
    }
  }
  return bVar1;
}

Assistant:

bool TextureParameterQueriesTestCase::testVirtualPageSizeIndexARB(const Functions& gl, GLint target,
																  GLint expectedError)
{
	const GLint pname = GL_VIRTUAL_PAGE_SIZE_INDEX_ARB;

	bool result = true;

	GLint   testValueInt;
	GLuint  testValueUInt;
	GLfloat testValueFloat;

	mLog << "Testing VIRTUAL_PAGE_SIZE_INDEX_ARB for target: " << target << " - ";

	//Check getTexParameter* default value
	if (expectedError == GL_NO_ERROR)
		result = checkGetTexParameter(gl, target, pname, 0);

	//Check getTexParameter* for manually set values
	if (result)
	{
		gl.texParameteri(target, pname, 1);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
			result = checkGetTexParameter(gl, target, pname, 1);

			//If no error verification reset TEXTURE_SPARSE_ARB value
			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteri", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		gl.texParameterf(target, pname, 2.0f);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterf error occurred");
			result = checkGetTexParameter(gl, target, pname, 2);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterf", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueInt = 8;
		gl.texParameteriv(target, pname, &testValueInt);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteriv error occurred");
			result = checkGetTexParameter(gl, target, pname, 8);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteriv", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueFloat = 10.0f;
		gl.texParameterfv(target, pname, &testValueFloat);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterfv error occurred");
			result = checkGetTexParameter(gl, target, pname, 10);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterfv", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueInt = 6;
		gl.texParameterIiv(target, pname, &testValueInt);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterIiv error occurred");
			result = checkGetTexParameter(gl, target, pname, 6);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIiv", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueUInt = 16;
		gl.texParameterIuiv(target, pname, &testValueUInt);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterIuiv error occurred");
			result = checkGetTexParameter(gl, target, pname, 16);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIuiv", target, pname, gl.getError(),
														  expectedError);
	}

	return result;
}